

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::TcpSocketEngine::TcpSocketEngine(TcpSocketEngine *this)

{
  HostAddress *pHVar1;
  HostAddress *in_RDI;
  
  in_RDI->m_protocol = UnknownNetworkProtocol;
  HostAddress::HostAddress(in_RDI);
  in_RDI[1].m_ip6Address.data[0] = '\0';
  in_RDI[1].m_ip6Address.data[1] = '\0';
  pHVar1 = in_RDI + 1;
  (pHVar1->m_ip6Address).data[4] = 0xff;
  (pHVar1->m_ip6Address).data[5] = 0xff;
  (pHVar1->m_ip6Address).data[6] = 0xff;
  (pHVar1->m_ip6Address).data[7] = 0xff;
  pHVar1 = in_RDI + 1;
  (pHVar1->m_ip6Address).data[8] = '\0';
  (pHVar1->m_ip6Address).data[9] = '\0';
  (pHVar1->m_ip6Address).data[10] = '\0';
  (pHVar1->m_ip6Address).data[0xb] = '\0';
  std::__cxx11::string::string((string *)&in_RDI[1].m_ipString);
  return;
}

Assistant:

TcpSocketEngine::TcpSocketEngine()
    : m_socketDescriptor(-1)
    //    , m_localPort(0)
    , m_remotePort(0)
    , m_socketError(TcpSocket::UnknownSocketError)
    , m_socketState(TcpSocket::UnconnectedState)
{}